

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_scheduler.c
# Opt level: O0

int mk_sched_event_close(mk_sched_conn *conn,mk_sched_worker *sched,int type,mk_server *server)

{
  mk_server *server_local;
  int type_local;
  mk_sched_worker *sched_local;
  mk_sched_conn *conn_local;
  
  mk_event_del(sched->loop,&conn->event);
  if (type != 3) {
    (*conn->protocol->cb_close)(conn,sched,type,server);
  }
  mk_sched_drop_connection(conn,sched,server);
  return 0;
}

Assistant:

int mk_sched_event_close(struct mk_sched_conn *conn,
                         struct mk_sched_worker *sched,
                         int type, struct mk_server *server)
{
    MK_TRACE("[FD %i] Connection Handler, closed", conn->event.fd);
    mk_event_del(sched->loop, &conn->event);

    if (type != MK_EP_SOCKET_DONE) {
        conn->protocol->cb_close(conn, sched, type, server);
    }
    /*
     * Remove the socket from the scheduler and make sure
     * to disable all notifications.
     */
    mk_sched_drop_connection(conn, sched, server);
    return 0;
}